

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::BeginPhase(Func *this,Phase tag)

{
  ScriptContextProfiler *pSVar1;
  code *pcVar2;
  Phase phase;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  Phase local_22 [4];
  Phase tag_local;
  
  local_22[0] = tag;
  JsUtil::List<Js::Phase,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (&(this->topFunc->currentPhases).list,local_22);
  phase = local_22[0];
  sourceContextId = GetSourceContextId(this);
  functionId = GetLocalFunctionId(this);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01430468,phase,sourceContextId,functionId);
  if (bVar3) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  pSVar1 = this->m_codeGenProfiler;
  bVar3 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if (bVar3 == (pSVar1 == (ScriptContextProfiler *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x4ef,
                       "((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))"
                       ,"Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (this->m_codeGenProfiler != (ScriptContextProfiler *)0x0) {
    Js::ScriptContextProfiler::ProfileBegin(this->m_codeGenProfiler,local_22[0]);
  }
  return;
}

Assistant:

void
Func::BeginPhase(Js::Phase tag)
{
#ifdef DBG
    this->GetTopFunc()->currentPhases.Push(tag);

    if (PHASE_DEBUGBREAK_ON_PHASE_BEGIN(tag, this))
    {
        __debugbreak();
    }
#endif

#ifdef PROFILE_EXEC
    AssertMsg((this->m_codeGenProfiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag),
        "Profiler tag is supplied but the profiler pointer is NULL");
    if (this->m_codeGenProfiler)
    {
        this->m_codeGenProfiler->ProfileBegin(tag);
    }
#endif
}